

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walker-inl.h
# Opt level: O0

void __thiscall re2::Regexp::Walker<int>::Walker(Walker<int> *this)

{
  stack<re2::WalkState<int>,std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>>
  *this_00;
  Walker<int> *this_local;
  
  this->_vptr_Walker = (_func_int **)&PTR__Walker_001c6548;
  this_00 = (stack<re2::WalkState<int>,std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>>
             *)operator_new(0x50);
  std::
  stack<re2::WalkState<int>,std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>>::
  stack<std::deque<re2::WalkState<int>,std::allocator<re2::WalkState<int>>>,void>(this_00);
  this->stack_ = (stack<re2::WalkState<int>,_std::deque<re2::WalkState<int>,_std::allocator<re2::WalkState<int>_>_>_>
                  *)this_00;
  this->stopped_early_ = false;
  return;
}

Assistant:

Regexp::Walker<T>::Walker() {
  stack_ = new stack<WalkState<T> >;
  stopped_early_ = false;
}